

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O1

Vector3D * CGL::SceneObjects::moller_trumbore(Vector3D *p0,Vector3D *p1,Vector3D *p2,Ray *r)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  Vector3D *t_b1_b2;
  Vector3D *in_RDI;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  auVar4 = *(undefined1 (*) [16])(p0->field_0).field_2.__vec;
  auVar5 = vsubpd_avx(*(undefined1 (*) [16])(p1->field_0).field_2.__vec,auVar4);
  dVar1 = (p0->field_0).field_0.z;
  dVar8 = (p1->field_0).field_0.z - dVar1;
  auVar6 = vsubpd_avx(*(undefined1 (*) [16])(p2->field_0).field_2.__vec,auVar4);
  dVar9 = (p2->field_0).field_0.z - dVar1;
  auVar7 = vsubpd_avx(*(undefined1 (*) [16])(r->o).field_0.field_2.__vec,auVar4);
  dVar1 = (r->o).field_0.field_0.z - dVar1;
  dVar2 = (r->d).field_0.field_0.y;
  dVar3 = (r->d).field_0.field_0.z;
  auVar4 = vshufpd_avx(auVar6,auVar6,1);
  dVar11 = (r->d).field_0.field_0.x;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar2 * dVar9 - auVar4._0_8_ * dVar3;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar3 * auVar6._0_8_ - dVar11 * dVar9;
  auVar13 = vunpcklpd_avx(auVar12,auVar13);
  dVar11 = dVar11 * auVar4._0_8_ - auVar6._0_8_ * dVar2;
  auVar4 = vshufpd_avx(auVar7,auVar7,1);
  auVar12 = vshufpd_avx(auVar5,auVar5,1);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = auVar4._0_8_ * dVar8 - auVar12._0_8_ * dVar1;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1 * auVar5._0_8_ - dVar8 * auVar7._0_8_;
  auVar14 = vunpcklpd_avx(auVar14,auVar15);
  dVar10 = auVar12._0_8_ * auVar7._0_8_ - auVar4._0_8_ * auVar5._0_8_;
  (in_RDI->field_0).field_0.x = 0.0;
  (in_RDI->field_0).field_0.y = 0.0;
  (in_RDI->field_0).field_0.z = 0.0;
  auVar4 = vdppd_avx(auVar14,auVar6,0x31);
  dVar2 = dVar10 * dVar9 + auVar4._0_8_;
  auVar4 = vdppd_avx(auVar13,auVar7,0x31);
  (in_RDI->field_0).field_0.x = dVar2;
  dVar1 = dVar11 * dVar1 + auVar4._0_8_;
  (in_RDI->field_0).field_0.y = dVar1;
  auVar4 = vdppd_avx(auVar14,*(undefined1 (*) [16])(r->d).field_0.field_2.__vec,0x31);
  auVar12 = vdppd_avx(auVar13,auVar5,0x31);
  dVar11 = 1.0 / (dVar11 * dVar8 + auVar12._0_8_);
  (in_RDI->field_0).field_0.x = dVar2 * dVar11;
  (in_RDI->field_0).field_0.y = dVar1 * dVar11;
  (in_RDI->field_0).field_0.z = (dVar10 * dVar3 + auVar4._0_8_) * dVar11;
  return in_RDI;
}

Assistant:

Vector3D moller_trumbore(const Vector3D &p0, const Vector3D &p1, const Vector3D &p2, const Ray &r) {
    Vector3D e1, e2, s, s1, s2;

    e1 = p1 - p0;
    e2 = p2 - p0;
    s = r.o - p0;

    s1 = cross(r.d, e2);
    s2 = cross(s, e1);

    Vector3D t_b1_b2 = Vector3D();
    t_b1_b2.x = dot(s2,  e2);
    t_b1_b2.y = dot(s1,   s);
    t_b1_b2.z = dot(s2, r.d);

    t_b1_b2 /= dot(s1, e1);

    return t_b1_b2;
}